

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicVector.hpp
# Opt level: O1

void __thiscall
OpenMD::DynamicVector<double,_std::allocator<double>_>::mul
          (DynamicVector<double,_std::allocator<double>_> *this,
          DynamicVector<double,_std::allocator<double>_> *v1,double s)

{
  double *pdVar1;
  double *pdVar2;
  pointer pdVar3;
  long lVar4;
  
  lVar4 = (long)(v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((long)(this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != lVar4) {
    std::vector<double,_std::allocator<double>_>::resize(&this->data_,lVar4 >> 3);
  }
  pdVar2 = (v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar1) {
    pdVar3 = (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *pdVar3 = *pdVar2 * s;
      pdVar2 = pdVar2 + 1;
      pdVar3 = pdVar3 + 1;
    } while (pdVar2 != pdVar1);
  }
  return;
}

Assistant:

void mul(const DynamicVector<Real>& v1, Real s) {
      if (this->size() != v1.size()) this->resize(v1.size());

      std::transform(v1.begin(), v1.end(), this->begin(),
                     [s](Real val) { return val * s; });
    }